

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O2

void Abc_NtkDeleteAll_rec(Abc_Obj_t *pObj)

{
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pObj_00;
  int i;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x13f,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
  }
  if ((pObj->vFanouts).nSize == 0) {
    vNodes = Vec_PtrAlloc((int)pObj);
    Abc_NodeCollectFanins(pObj,vNodes);
    Abc_NtkDeleteObj(pObj);
    for (i = 0; i < vNodes->nSize; i = i + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,i);
      if (((*(uint *)&pObj_00->field_0x14 & 0xf) != 7) && ((pObj_00->vFanouts).nSize == 0)) {
        Abc_NtkDeleteAll_rec(pObj_00);
      }
    }
    Vec_PtrFree(vNodes);
    return;
  }
  __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                ,0x140,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
}

Assistant:

void Abc_NtkDeleteAll_rec( Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteAll_rec( pObj );
    Vec_PtrFree( vNodes );
}